

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DualStringMappedVector.hpp
# Opt level: O0

optional<unsigned_long> __thiscall
gmlc::containers::
DualStringMappedVector<helics::BasicFedInfo,helics::GlobalFederateId,(reference_stability)1,5>::
insert<std::basic_string_view<char,std::char_traits<char>>&>(void *param_1)

{
  bool bVar1;
  _Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_true>
  this;
  _Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_true>
  args;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar2;
  optional<unsigned_long> oVar3;
  size_type index;
  iterator fnd;
  unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>_>
  *in_stack_ffffffffffffff88;
  vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_> *__t;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffffa0;
  undefined7 in_stack_ffffffffffffffa1;
  _Storage<unsigned_long,_true> local_10;
  undefined1 local_8;
  
  this._M_cur = (__node_type *)
                std::
                unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>_>
                ::find(in_stack_ffffffffffffff88,(key_type *)0x53f4a0);
  args._M_cur = (__node_type *)
                std::
                unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>_>
                ::end(in_stack_ffffffffffffff88);
  bVar1 = std::__detail::operator==
                    ((_Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_true>
                      *)&stack0xffffffffffffffc0,
                     (_Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_true>
                      *)&stack0xffffffffffffffb8);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    CLI::std::vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>::size
              ((vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_> *)param_1);
    std::vector<helics::BasicFedInfo,std::allocator<helics::BasicFedInfo>>::
    emplace_back<std::basic_string_view<char,std::char_traits<char>>&>
              ((vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_> *)
               CONCAT71(in_stack_ffffffffffffffa1,in_stack_ffffffffffffffa0),
               (basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff98);
    StableBlockVector<std::__cxx11::string,5u,std::allocator<std::__cxx11::string>>::
    emplace_back<std::basic_string_view<char,std::char_traits<char>>&>
              ((StableBlockVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5U,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this._M_cur,(basic_string_view<char,_std::char_traits<char>_> *)args._M_cur);
    __t = (vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_> *)
          ((long)param_1 + 0x18);
    StableBlockVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5U,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::back((StableBlockVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5U,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&(((vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_> *)
                ((long)param_1 + 0x48))->
               super__Vector_base<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>).
               _M_impl.super__Vector_impl_data._M_finish);
    std::
    unordered_map<std::basic_string_view<char,std::char_traits<char>>,unsigned_long,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,unsigned_long>>>
    ::emplace<std::__cxx11::string&,unsigned_long&>
              ((unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>_>
                *)CONCAT71(in_stack_ffffffffffffffa1,in_stack_ffffffffffffffa0),
               in_stack_ffffffffffffff98,(unsigned_long *)param_1);
    std::optional<unsigned_long>::optional<unsigned_long,_true>
              ((optional<unsigned_long> *)param_1,(unsigned_long *)__t);
    uVar2 = extraout_RDX_00;
  }
  else {
    std::optional<unsigned_long>::optional((optional<unsigned_long> *)&local_10);
    uVar2 = extraout_RDX;
  }
  oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._9_7_ = (undefined7)((ulong)uVar2 >> 8);
  oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_engaged = (bool)local_8;
  oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value = local_10._M_value;
  return (optional<unsigned_long>)
         oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>;
}

Assistant:

std::optional<size_t> insert(
            std::string_view searchValue1,
            no_search_type /*searchValue2*/,
            Us&&... data)
        {
            auto fnd = lookup1.find(searchValue1);
            if (fnd != lookup1.end()) {
                return std::nullopt;
            }
            auto index = dataStorage.size();
            dataStorage.emplace_back(std::forward<Us>(data)...);
            names.emplace_back(searchValue1);
            lookup1.emplace(names.back(), index);
            return index;
        }